

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::fill_n<fmt::v10::appender,int,char>(appender out,int count,char *value)

{
  value_type *__value;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *this;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_38;
  int local_2c;
  char *pcStack_28;
  int i;
  char *value_local;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bStack_18;
  int count_local;
  appender out_local;
  
  pcStack_28 = value;
  value_local._4_4_ = count;
  bStack_18 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  for (local_2c = 0; __value = pcStack_28, local_2c < value_local._4_4_; local_2c = local_2c + 1) {
    local_38.container =
         (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
    this = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(this,__value);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bStack_18.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}